

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

bool __thiscall dmlc::JSONReader::NextObjectItem(JSONReader *this,string *out_key)

{
  bool bVar1;
  reference pvVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  string local_3b0;
  LogMessageFatal local_390;
  char local_201;
  LogCheckError local_200;
  LogCheckError _check_err_1;
  int ch_2;
  int ch_1;
  LogMessageFatal local_1d0;
  char local_31;
  LogCheckError local_30;
  LogCheckError _check_err;
  int ch;
  bool next;
  string *out_key_local;
  JSONReader *this_local;
  
  _check_err.str._7_1_ = 1;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_);
  if (*pvVar2 == 0) {
    _check_err_1.str._4_4_ = PeekNextNonSpace(this);
    if (_check_err_1.str._4_4_ == 0x7d) {
      NextChar(this);
      _check_err.str._7_1_ = 0;
    }
  }
  else {
    _check_err.str._0_4_ = NextNonSpace(this);
    if ((int)_check_err.str == -1) {
      _check_err.str._7_1_ = 0;
    }
    else if ((int)_check_err.str == 0x7d) {
      _check_err.str._7_1_ = 0;
    }
    else {
      local_31 = ',';
      LogCheck_EQ<int,char>((dmlc *)&local_30,(int *)&_check_err,&local_31);
      bVar1 = LogCheckError::operator_cast_to_bool(&local_30);
      if (bVar1) {
        LogMessageFatal::LogMessageFatal
                  (&local_1d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                   ,0x305);
        poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_1d0);
        poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
        poVar4 = std::operator<<(poVar4,"ch == \',\'");
        poVar4 = std::operator<<(poVar4,(string *)local_30.str);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,"Error at");
        line_info_abi_cxx11_((string *)&ch_2,this);
        poVar4 = std::operator<<(poVar4,(string *)&ch_2);
        poVar4 = std::operator<<(poVar4,", JSON object expect \'}\' or \',\' \'");
        poVar4 = std::operator<<(poVar4,(char)_check_err.str);
        std::operator<<(poVar4,'\'');
        std::__cxx11::string::~string((string *)&ch_2);
        LogMessageFatal::~LogMessageFatal(&local_1d0);
      }
      LogCheckError::~LogCheckError(&local_30);
    }
  }
  if ((_check_err.str._7_1_ & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->scope_counter_);
    this_local._7_1_ = false;
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->scope_counter_)
    ;
    *pvVar2 = *pvVar2 + 1;
    ReadString(this,out_key);
    _check_err_1.str._0_4_ = NextNonSpace(this);
    local_201 = ':';
    LogCheck_EQ<int,char>((dmlc *)&local_200,(int *)&_check_err_1,&local_201);
    bVar1 = LogCheckError::operator_cast_to_bool(&local_200);
    if (bVar1) {
      LogMessageFatal::LogMessageFatal
                (&local_390,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x317);
      poVar3 = LogMessageFatal::stream_abi_cxx11_(&local_390);
      poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
      poVar4 = std::operator<<(poVar4,"ch == \':\'");
      poVar4 = std::operator<<(poVar4,(string *)local_200.str);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,"Error at");
      line_info_abi_cxx11_(&local_3b0,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_3b0);
      poVar4 = std::operator<<(poVar4,", Expect \':\' but get \'");
      poVar4 = std::operator<<(poVar4,(char)_check_err_1.str);
      std::operator<<(poVar4,'\'');
      std::__cxx11::string::~string((string *)&local_3b0);
      LogMessageFatal::~LogMessageFatal(&local_390);
    }
    LogCheckError::~LogCheckError(&local_200);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool JSONReader::NextObjectItem(std::string *out_key) {
  bool next = true;
  if (scope_counter_.back() != 0) {
    int ch = NextNonSpace();
    if (ch == EOF) {
      next = false;
    } else if (ch == '}') {
      next = false;
    } else {
      CHECK_EQ(ch, ',')
          << "Error at" << line_info()
          << ", JSON object expect \'}\' or \',\' \'" << static_cast<char>(ch) << '\'';
    }
  } else {
    int ch = PeekNextNonSpace();
    if (ch == '}') {
      NextChar();
      next = false;
    }
  }
  if (!next) {
    scope_counter_.pop_back();
    return false;
  } else {
    scope_counter_.back() += 1;
    ReadString(out_key);
    int ch = NextNonSpace();
    CHECK_EQ(ch, ':')
        << "Error at" << line_info()
        << ", Expect \':\' but get \'" << static_cast<char>(ch) << '\'';
    return true;
  }
}